

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future.c
# Opt level: O0

int async(thread_pool_t *pool,future_t *future,callable_t callable)

{
  runnable_t runnable;
  int iVar1;
  callable_t *pcVar2;
  int err;
  future_t *future_local;
  thread_pool_t *pool_local;
  
  if ((pool == (thread_pool_t *)0x0) || (future == (future_t *)0x0)) {
    pool_local._4_4_ = -3;
  }
  else {
    pcVar2 = (callable_t *)malloc(0x18);
    future->callable = pcVar2;
    if (pcVar2 == (callable_t *)0x0) {
      pool_local._4_4_ = -2;
    }
    else {
      future->callable->function = callable.function;
      future->callable->arg = callable.arg;
      future->callable->argsz = callable.argsz;
      iVar1 = sem_init((sem_t *)&future->mutex,0,0);
      if (iVar1 == 0) {
        future->status = true;
        runnable.arg = future;
        runnable.function = fun;
        runnable.argsz = 0x40;
        pool_local._4_4_ = defer(pool,runnable);
        if (pool_local._4_4_ == 0) {
          pool_local._4_4_ = 0;
        }
        else {
          free(future->callable);
        }
      }
      else {
        free(future->callable);
        pool_local._4_4_ = -4;
      }
    }
  }
  return pool_local._4_4_;
}

Assistant:

int async(thread_pool_t *pool, future_t *future, callable_t callable) {
    if (!pool || !future) {
        return invalid_argument_error;
    }

    if (!(future->callable = malloc(sizeof(callable_t)))) {
        return memory_error;
    }

    future->callable->function = callable.function;
    future->callable->arg = callable.arg;
    future->callable->argsz = callable.argsz;

    if (sem_init(&(future->mutex), THREAD_SEMAPHORE, 0)) {
        free(future->callable);
        return semaphore_error;
    }

    future->status = pending;

    int err;

    if ((err = defer(pool, (runnable_t) {
            .function = fun,
            .arg = future,
            .argsz = sizeof(future_t)}))) {
        free(future->callable);
        return err;
    }

    return success;
}